

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.h
# Opt level: O1

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxDevexPR(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  ~SPxDevexPR(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

virtual ~SPxDevexPR()
   {}